

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O1

Box * __thiscall amrex::Box::operator&=(Box *this,Box *rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (rhs->smallend).vect[0];
  iVar2 = (this->smallend).vect[0];
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = (this->smallend).vect[1];
  (this->smallend).vect[0] = iVar1;
  iVar1 = (rhs->smallend).vect[1];
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  (this->smallend).vect[1] = iVar1;
  iVar1 = (this->smallend).vect[2];
  iVar2 = (rhs->smallend).vect[2];
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  (this->smallend).vect[2] = iVar2;
  iVar1 = (this->bigend).vect[0];
  iVar2 = (rhs->bigend).vect[0];
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  (this->bigend).vect[0] = iVar2;
  iVar1 = (this->bigend).vect[1];
  iVar2 = (rhs->bigend).vect[1];
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  (this->bigend).vect[1] = iVar2;
  iVar1 = (this->bigend).vect[2];
  iVar2 = (rhs->bigend).vect[2];
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  (this->bigend).vect[2] = iVar2;
  return this;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    Box& operator&= (const Box& rhs) noexcept
    {
        BL_ASSERT(sameType(rhs));
        smallend.max(rhs.smallend);
        bigend.min(rhs.bigend);
        return *this;
    }